

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkStopTests(ARKodeMem ark_mem,realtype tout,N_Vector yout,realtype *tret,int itask,int *ier)

{
  double dVar1;
  realtype rVar2;
  int iVar3;
  int iVar4;
  ARKodeRootMem pAVar5;
  char *msgfmt;
  double dVar6;
  double dVar7;
  
  dVar7 = (ABS(ark_mem->h) + ABS(ark_mem->tcur)) * ark_mem->uround * 100.0;
  pAVar5 = ark_mem->root_mem;
  if ((pAVar5 == (ARKodeRootMem)0x0) || (pAVar5->nrtfn < 1)) goto LAB_004b649a;
  iVar4 = pAVar5->irfnd;
  if ((iVar4 != 0 && ark_mem->call_fullrhs == 0) &&
     (iVar3 = (*ark_mem->step_fullrhs)(ark_mem,ark_mem->tcur,ark_mem->yn,ark_mem->fn,1), iVar3 != 0)
     ) {
    arkProcessError(ark_mem,-8,"ARKode","arkStopTests",
                    "At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
    *ier = -8;
    return 1;
  }
  iVar3 = arkRootCheck2(ark_mem);
  if (iVar3 == -0xc) {
    arkProcessError(ark_mem,-0xc,"ARKode","arkStopTests",
                    "At t = %lg, the rootfinding routine failed in an unrecoverable manner.",
                    ark_mem->root_mem->tlo);
    *ier = -0xc;
    return 1;
  }
  if (iVar3 == 1) {
    pAVar5 = ark_mem->root_mem;
LAB_004b63c7:
    rVar2 = pAVar5->tlo;
    *tret = rVar2;
    ark_mem->tretlast = rVar2;
    *ier = 2;
    return 1;
  }
  if (iVar3 == 3) {
    tout = ark_mem->root_mem->tlo;
    msgfmt = "Root found at and very near t = %lg.";
    goto LAB_004b651d;
  }
  if (ABS(ark_mem->tcur - ark_mem->tretlast) <= dVar7) {
LAB_004b649a:
    if (itask != 2) {
      if ((itask != 1) || ((ark_mem->tcur - tout) * ark_mem->h < 0.0)) {
LAB_004b6585:
        if (ark_mem->tstopset == 0) {
          return 0;
        }
        dVar6 = ark_mem->tstop;
        dVar1 = ark_mem->tcur;
        if (ABS(dVar1 - dVar6) <= dVar7) {
          iVar4 = arkGetDky(ark_mem,dVar6,0,yout);
          *ier = iVar4;
          rVar2 = ark_mem->tstop;
          if (iVar4 != 0) {
            arkProcessError(ark_mem,-0x16,"ARKode","arkStopTests",
                            "The value tstop = %lg is behind current t = %lg in the direction of integration."
                            ,rVar2,ark_mem->tcur);
            *ier = -0x16;
            return 1;
          }
          *tret = rVar2;
          ark_mem->tretlast = rVar2;
          ark_mem->tstopset = 0;
          *ier = 1;
          return 1;
        }
        if (0.0 < ((ark_mem->hprime + dVar1) - dVar6) * ark_mem->h) {
          dVar7 = (ark_mem->uround * -4.0 + 1.0) * (dVar6 - dVar1);
          ark_mem->hprime = dVar7;
          ark_mem->eta = dVar7 / ark_mem->h;
          return 0;
        }
        return 0;
      }
      *tret = tout;
      ark_mem->tretlast = tout;
      iVar4 = arkGetDky(ark_mem,tout,0,yout);
      *ier = iVar4;
      if (iVar4 != 0) {
        msgfmt = 
        "Trouble interpolating at tout = %lg. tout too far back in direction of integration";
LAB_004b651d:
        arkProcessError(ark_mem,-0x16,"ARKode","arkStopTests",msgfmt,tout);
        *ier = -0x16;
        return 1;
      }
      goto LAB_004b657b;
    }
    dVar6 = ark_mem->tcur;
    if (ABS(dVar6 - ark_mem->tretlast) <= dVar7) goto LAB_004b6585;
  }
  else {
    iVar3 = arkRootCheck3(ark_mem);
    if (iVar3 == -0xc) {
      arkProcessError(ark_mem,-0xc,"ARKode","arkStopTests",
                      "At t = %lg, the rootfinding routine failed in an unrecoverable manner.",
                      ark_mem->root_mem->tlo);
      *ier = -0xc;
      return 1;
    }
    if (iVar3 == 1) {
      pAVar5 = ark_mem->root_mem;
      pAVar5->irfnd = 1;
      goto LAB_004b63c7;
    }
    if ((iVar3 != 0) || (ark_mem->root_mem->irfnd = 0, itask != 2 || iVar4 != 1)) goto LAB_004b649a;
    dVar6 = ark_mem->tcur;
  }
  *tret = dVar6;
  ark_mem->tretlast = dVar6;
  N_VScale(1.0,ark_mem->yn,yout);
LAB_004b657b:
  *ier = 0;
  return 1;
}

Assistant:

int arkStopTests(ARKodeMem ark_mem, realtype tout, N_Vector yout,
                 realtype *tret, int itask, int *ier)
{
  int irfndp, retval;
  realtype troundoff;

  /* Estimate an infinitesimal time interval to be used as
     a roundoff for time quantities (based on current time
     and step size) */
  troundoff = FUZZ_FACTOR*ark_mem->uround *
    (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

  /* First, check for a root in the last step taken, other than the
     last root found, if any.  If itask = ARK_ONE_STEP and y(tn) was not
     returned because of an intervening root, return y(tn) now.     */
  if (ark_mem->root_mem != NULL)
    if (ark_mem->root_mem->nrtfn > 0) {

      /* Shortcut to roots found in previous step */
      irfndp = ark_mem->root_mem->irfnd;

      /* If the full rhs was not computed in the last call to arkCompleteStep
         and roots were found in the previous step, then compute the full rhs
         for possible use in arkRootCheck2 (not always necessary) */
      if (!(ark_mem->call_fullrhs) && irfndp != 0) {
        retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tcur, ark_mem->yn,
                                       ark_mem->fn, ARK_FULLRHS_END);
        if (retval != 0) {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode", "arkStopTests",
                          MSG_ARK_RHSFUNC_FAILED);
          *ier = ARK_RHSFUNC_FAIL;
          return(1);
        }
      }

      retval = arkRootCheck2((void*) ark_mem);

      if (retval == CLOSERT) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkStopTests",
                        MSG_ARK_CLOSE_ROOTS, ark_mem->root_mem->tlo);
        *ier = ARK_ILL_INPUT;
        return(1);
      } else if (retval == ARK_RTFUNC_FAIL) {
        arkProcessError(ark_mem, ARK_RTFUNC_FAIL, "ARKode", "arkStopTests",
                        MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
        *ier = ARK_RTFUNC_FAIL;
        return(1);
      } else if (retval == RTFOUND) {
        ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
        *ier = ARK_ROOT_RETURN;
        return(1);
      }

      /* If tn is distinct from tretlast (within roundoff),
         check remaining interval for roots */
      if ( SUNRabs(ark_mem->tcur - ark_mem->tretlast) > troundoff ) {

        retval = arkRootCheck3((void*) ark_mem);

        if (retval == ARK_SUCCESS) {     /* no root found */
          ark_mem->root_mem->irfnd = 0;
          if ((irfndp == 1) && (itask == ARK_ONE_STEP)) {
            ark_mem->tretlast = *tret = ark_mem->tcur;
            N_VScale(ONE, ark_mem->yn, yout);
            *ier = ARK_SUCCESS;
            return(1);
          }
        } else if (retval == RTFOUND) {  /* a new root was found */
          ark_mem->root_mem->irfnd = 1;
          ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
          *ier = ARK_ROOT_RETURN;
          return(1);
        } else if (retval == ARK_RTFUNC_FAIL) {  /* g failed */
          arkProcessError(ark_mem, ARK_RTFUNC_FAIL, "ARKode", "arkStopTests",
                          MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
          *ier = ARK_RTFUNC_FAIL;
          return(1);
        }
      }

    } /* end of root stop check */

  /* In ARK_NORMAL mode, test if tout was reached */
  if ( (itask == ARK_NORMAL) &&
       ((ark_mem->tcur-tout)*ark_mem->h >= ZERO) ) {
    ark_mem->tretlast = *tret = tout;
    *ier = arkGetDky(ark_mem, tout, 0, yout);
    if (*ier != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                      "arkStopTests", MSG_ARK_BAD_TOUT, tout);
      *ier = ARK_ILL_INPUT;
      return(1);
    }
    *ier = ARK_SUCCESS;
    return(1);
  }

  /* In ARK_ONE_STEP mode, test if tn was returned */
  if ( itask == ARK_ONE_STEP &&
       SUNRabs(ark_mem->tcur - ark_mem->tretlast) > troundoff ) {
    ark_mem->tretlast = *tret = ark_mem->tcur;
    N_VScale(ONE, ark_mem->yn, yout);
    *ier = ARK_SUCCESS;
    return(1);
  }

  /* Test for tn at tstop or near tstop */
  if ( ark_mem->tstopset ) {

    if ( SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff) {
      *ier = arkGetDky(ark_mem, ark_mem->tstop, 0, yout);
      if (*ier != ARK_SUCCESS) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkStopTests",
                        MSG_ARK_BAD_TSTOP, ark_mem->tstop, ark_mem->tcur);
        *ier = ARK_ILL_INPUT;
        return(1);
      }
      ark_mem->tretlast = *tret = ark_mem->tstop;
      ark_mem->tstopset = SUNFALSE;
      *ier = ARK_TSTOP_RETURN;
      return(1);
    }

    /* If next step would overtake tstop, adjust stepsize */
    if ( (ark_mem->tcur + ark_mem->hprime - ark_mem->tstop)*ark_mem->h > ZERO ) {
      ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur)*(ONE-FOUR*ark_mem->uround);
      ark_mem->eta = ark_mem->hprime/ark_mem->h;
    }
  }

  return(0);
}